

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

Index __thiscall
wabt::interp::FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>
          (FreeList<wabt::interp::Ref> *this,Ref *args)

{
  size_t sVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  size_type sVar5;
  size_type sVar6;
  reference local_48;
  reference local_38;
  FreeList<wabt::interp::Ref> *local_28;
  Index index;
  Ref *args_local;
  FreeList<wabt::interp::Ref> *this_local;
  
  index = (Index)args;
  args_local = (Ref *)this;
  bVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(&this->free_);
  if (bVar2) {
    sVar5 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::size(&this->list_);
    sVar6 = std::vector<bool,_std::allocator<bool>_>::size(&this->is_free_);
    if (sVar5 != sVar6) {
      __assert_fail("list_.size() == is_free_.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp-inl.h"
                    ,0x98,
                    "Index wabt::interp::FreeList<wabt::interp::Ref>::New(Args &&...) [T = wabt::interp::Ref, Args = <wabt::interp::Ref &>]"
                   );
    }
    std::vector<bool,_std::allocator<bool>_>::push_back(&this->is_free_,false);
    std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
    emplace_back<wabt::interp::Ref&>
              ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)this,(Ref *)index);
    sVar5 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::size(&this->list_);
    this_local = (FreeList<wabt::interp::Ref> *)(sVar5 - 1);
  }
  else {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->free_);
    local_28 = (FreeList<wabt::interp::Ref> *)*pvVar3;
    local_38 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (&this->is_free_,(size_type)local_28);
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_38);
    if (!bVar2) {
      __assert_fail("is_free_[index]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp-inl.h"
                    ,0x92,
                    "Index wabt::interp::FreeList<wabt::interp::Ref>::New(Args &&...) [T = wabt::interp::Ref, Args = <wabt::interp::Ref &>]"
                   );
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&this->free_);
    local_48 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (&this->is_free_,(size_type)local_28);
    std::_Bit_reference::operator=(&local_48,false);
    sVar1 = *(size_t *)index;
    pvVar4 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                       (&this->list_,(size_type)local_28);
    pvVar4->index = sVar1;
    this_local = local_28;
  }
  return (Index)this_local;
}

Assistant:

auto FreeList<T>::New(Args&&... args) -> Index {
  if (!free_.empty()) {
    Index index = free_.back();
    assert(is_free_[index]);
    free_.pop_back();
    is_free_[index] = false;
    list_[index] = T(std::forward<Args>(args)...);
    return index;
  }
  assert(list_.size() == is_free_.size());
  is_free_.push_back(false);
  list_.emplace_back(std::forward<Args>(args)...);
  return list_.size() - 1;
}